

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_0xx8_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  if (quads[2] == 0) {
    switch(quads[1]) {
    case 0:
      sh4asm_txt_clrt(em);
      break;
    case 1:
      sh4asm_txt_sett(em);
      break;
    case 2:
      sh4asm_txt_clrmac(em);
      break;
    case 3:
      sh4asm_txt_ldtlb(em);
      break;
    case 4:
      sh4asm_txt_clrs(em);
      break;
    case 5:
      sh4asm_txt_sets(em);
      break;
    default:
      sh4asm_opcode_non_inst_(quads,em);
    }
  }
  else {
    sh4asm_opcode_non_inst_(quads,em);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_0xx8_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    // mask is 0xffff
    if (quads[2] != 0) {
        sh4asm_opcode_non_inst_(quads, em);
        return;
    }

    switch (quads[1]) {
    case 0:
        sh4asm_txt_clrt(em);
        break;
    case 1:
        sh4asm_txt_sett(em);
        break;
    case 2:
        sh4asm_txt_clrmac(em);
        break;
    case 3:
        sh4asm_txt_ldtlb(em);
        break;
    case 4:
        sh4asm_txt_clrs(em);
        break;
    case 5:
        sh4asm_txt_sets(em);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}